

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O3

void __thiscall FGameConfigFile::SetRavenDefaults(FGameConfigFile *this,bool isHexen)

{
  FBoolCVar::SetGenericRepDefault(&wi_percents,(UCVarValue)0x0,CVAR_Bool);
  FBoolCVar::SetGenericRepDefault(&con_centernotify,(UCVarValue)0x1,CVAR_Bool);
  FBoolCVar::SetGenericRepDefault(&snd_pitched,(UCVarValue)0x1,CVAR_Bool);
  FIntCVar::SetGenericRepDefault(&msg0color,(UCVarValue)0x9,CVAR_Int);
  FIntCVar::SetGenericRepDefault(&msgmidcolor,(UCVarValue)0x9,CVAR_Int);
  FIntCVar::SetGenericRepDefault(&msgmidcolor2,(UCVarValue)0xa,CVAR_Int);
  FColorCVar::SetGenericRepDefault(&am_wallcolor,(UCVarValue)0x543b17,CVAR_Int);
  FColorCVar::SetGenericRepDefault(&am_fdwallcolor,(UCVarValue)0xd0b085,CVAR_Int);
  FColorCVar::SetGenericRepDefault(&am_cdwallcolor,(UCVarValue)0x734323,CVAR_Int);
  if (((am_wallcolor.super_FIntCVar.Value == 0x2c1808) &&
      (am_fdwallcolor.super_FIntCVar.Value == 0x887058)) &&
     (am_cdwallcolor.super_FIntCVar.Value == 0x4c3820)) {
    FBaseCVar::ResetToDefault((FBaseCVar *)&am_wallcolor);
    FBaseCVar::ResetToDefault((FBaseCVar *)&am_fdwallcolor);
    FBaseCVar::ResetToDefault((FBaseCVar *)&am_cdwallcolor);
  }
  if (isHexen) {
    return;
  }
  FColorCVar::SetGenericRepDefault(&::color,(UCVarValue)0x3f6040,CVAR_Int);
  return;
}

Assistant:

void FGameConfigFile::SetRavenDefaults (bool isHexen)
{
	UCVarValue val;

	val.Bool = false;
	wi_percents.SetGenericRepDefault (val, CVAR_Bool);
	val.Bool = true;
	con_centernotify.SetGenericRepDefault (val, CVAR_Bool);
	snd_pitched.SetGenericRepDefault (val, CVAR_Bool);
	val.Int = 9;
	msg0color.SetGenericRepDefault (val, CVAR_Int);
	val.Int = CR_WHITE;
	msgmidcolor.SetGenericRepDefault (val, CVAR_Int);
	val.Int = CR_YELLOW;
	msgmidcolor2.SetGenericRepDefault (val, CVAR_Int);

	val.Int = 0x543b17;
	am_wallcolor.SetGenericRepDefault (val, CVAR_Int);
	val.Int = 0xd0b085;
	am_fdwallcolor.SetGenericRepDefault (val, CVAR_Int);
	val.Int = 0x734323;
	am_cdwallcolor.SetGenericRepDefault (val, CVAR_Int);

	// Fix the Heretic/Hexen automap colors so they are correct.
	// (They were wrong on older versions.)
	if (*am_wallcolor == 0x2c1808 && *am_fdwallcolor == 0x887058 && *am_cdwallcolor == 0x4c3820)
	{
		am_wallcolor.ResetToDefault ();
		am_fdwallcolor.ResetToDefault ();
		am_cdwallcolor.ResetToDefault ();
	}

	if (!isHexen)
	{
		val.Int = 0x3f6040;
		color.SetGenericRepDefault (val, CVAR_Int);
	}
}